

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

bool kratos::TransformIfCase::has_target_if
               (Stmt *stmt,Var **var,
               vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
               *if_stmts)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  Var *pVVar1;
  bool bVar2;
  StatementType SVar3;
  VarType VVar4;
  size_type sVar5;
  element_type *this_00;
  element_type *peVar6;
  element_type *peVar7;
  __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var8;
  StmtBlock *pSVar9;
  uint64_t uVar10;
  element_type *peVar11;
  element_type *stmt_00;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  shared_ptr<kratos::Expr> expr;
  undefined1 local_48 [8];
  shared_ptr<kratos::Var> predicate;
  shared_ptr<kratos::IfStmt> if_;
  vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
  *if_stmts_local;
  Var **var_local;
  Stmt *stmt_local;
  
  SVar3 = Stmt::type(stmt);
  if ((SVar3 != If) &&
     (sVar5 = std::
              vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
              ::size(if_stmts), sVar5 < 2)) {
    return false;
  }
  SVar3 = Stmt::type(stmt);
  if (SVar3 != If) {
    return true;
  }
  this = &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  Stmt::as<kratos::IfStmt>((Stmt *)this);
  std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  IfStmt::predicate((IfStmt *)local_48);
  this_00 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )local_48);
  VVar4 = Var::type(this_00);
  if (VVar4 != Expression) {
    stmt_local._7_1_ = false;
    expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
    goto LAB_003aa2de;
  }
  std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_48)
  ;
  Var::as<kratos::Expr>((Var *)local_68);
  peVar6 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_68);
  if (peVar6->op == Eq) {
    if (*var == (Var *)0x0) {
      peVar6 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
      *var = peVar6->left;
    }
    else {
      pVVar1 = *var;
      peVar6 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
      if (pVVar1 != peVar6->left) {
        stmt_local._7_1_ = false;
        goto LAB_003aa2c8;
      }
    }
    peVar6 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
    VVar4 = Var::type(peVar6->right);
    if (VVar4 != ConstValue) {
      peVar6 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
      VVar4 = Var::type(peVar6->right);
      if (VVar4 != Parameter) {
        stmt_local._7_1_ = false;
        goto LAB_003aa2c8;
      }
    }
    peVar7 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    p_Var8 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)IfStmt::else_body(peVar7);
    pSVar9 = &std::
              __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(p_Var8)->super_StmtBlock;
    uVar10 = StmtBlock::size(pSVar9);
    if (uVar10 < 2) {
      std::vector<std::shared_ptr<kratos::IfStmt>,std::allocator<std::shared_ptr<kratos::IfStmt>>>::
      emplace_back<std::shared_ptr<kratos::IfStmt>&>
                ((vector<std::shared_ptr<kratos::IfStmt>,std::allocator<std::shared_ptr<kratos::IfStmt>>>
                  *)if_stmts,
                 (shared_ptr<kratos::IfStmt> *)
                 &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      peVar7 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      p_Var8 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)IfStmt::else_body(peVar7);
      pSVar9 = &std::
                __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var8)->super_StmtBlock;
      bVar2 = StmtBlock::empty(pSVar9);
      if (bVar2) {
        stmt_local._7_1_ = true;
      }
      else {
        peVar7 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&predicate.
                                  super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
        p_Var8 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)IfStmt::else_body(peVar7);
        peVar11 = std::
                  __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*(p_Var8);
        StmtBlock::operator[]((StmtBlock *)local_78,(uint32_t)peVar11);
        stmt_00 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)local_78);
        stmt_local._7_1_ = has_target_if(stmt_00,var,if_stmts);
        std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_78);
      }
    }
    else {
      stmt_local._7_1_ = false;
    }
  }
  else {
    stmt_local._7_1_ = false;
  }
LAB_003aa2c8:
  expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
  std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_68);
LAB_003aa2de:
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_48);
  std::shared_ptr<kratos::IfStmt>::~shared_ptr
            ((shared_ptr<kratos::IfStmt> *)
             &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return stmt_local._7_1_;
}

Assistant:

bool static has_target_if(Stmt* stmt, Var*& var,
                              std::vector<std::shared_ptr<IfStmt>>& if_stmts) {
        // keep track of which statement are used later to transform into switch statement
        if (stmt->type() != StatementType::If && if_stmts.size() <= 1)
            return false;
        else if (stmt->type() != StatementType::If) {
            // we have reach the end of the if-else chain
            return true;
        }
        auto if_ = stmt->as<IfStmt>();
        auto predicate = if_->predicate();
        // predicate has to be a expression with equal comparison
        if (predicate->type() != VarType::Expression) return false;
        auto expr = predicate->as<Expr>();
        if (expr->op != ExprOp::Eq) return false;
        // has to be the same variable
        if (var == nullptr) {
            var = expr->left;
        } else {
            if (var != expr->left) return false;
        }
        if ((expr->right->type() != VarType::ConstValue) &&
            (expr->right->type() != VarType::Parameter))
            return false;
        if (if_->else_body()->size() > 1) return false;

        if_stmts.emplace_back(if_);
        if (if_->else_body()->empty()) {
            return true;
        } else {
            return has_target_if((*if_->else_body())[0].get(), var, if_stmts);
        }
    }